

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O1

int isDialogVersionBetter09b(void)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *__src;
  char *pcVar5;
  char *__nptr;
  size_t sVar6;
  char lBuff [128];
  char local_b8 [136];
  
  dialogNameOnly();
  uVar4 = 0;
  if (dialogNameOnly::lDialogName[0] != '\0') {
    __src = getVersion(dialogNameOnly::lDialogName);
    if (__src != (char *)0x0) {
      strcpy(local_b8,__src);
      pcVar5 = strtok(__src," ,.-");
      iVar2 = atoi(pcVar5);
      pcVar5 = strtok((char *)0x0," ,.-abcdefghijklmnopqrstuvxyz");
      iVar3 = atoi(pcVar5);
      __nptr = strtok((char *)0x0," ,.-");
      uVar4 = atoi(__nptr);
      uVar1 = -uVar4;
      if (0 < (int)uVar4) {
        uVar1 = uVar4;
      }
      sVar6 = strlen(pcVar5);
      strcpy(__src,local_b8);
      strtok(pcVar5 + sVar6," ,.-");
      uVar4 = 1;
      if (iVar2 < 1) {
        if (iVar3 == 9) {
          uVar4 = 0;
          if (pcVar5[sVar6] == 'b') {
            uVar4 = (uint)(0x131a695 < uVar1);
          }
        }
        else {
          uVar4 = 0;
        }
      }
    }
  }
  return uVar4;
}

Assistant:

int isDialogVersionBetter09b( )
{
        char const * lDialogName ;
        char * lVersion ;
        int lMajor ;
        int lMinor ;
        int lDate ;
        int lResult ;
        char * lMinorP ;
        char * lLetter ;
        char lBuff[128] ;

        /*char lTest[128] = " 0.9b-20031126" ;*/

        lDialogName = dialogNameOnly() ;
        if ( ! strlen(lDialogName) || !(lVersion = (char *) getVersion(lDialogName)) ) return 0 ;
        /*lVersion = lTest ;*/
        /*printf("lVersion %s\n", lVersion);*/
        strcpy(lBuff,lVersion);
        lMajor = atoi( strtok(lVersion," ,.-") ) ;
        /*printf("lMajor %d\n", lMajor);*/
        lMinorP = strtok(0," ,.-abcdefghijklmnopqrstuvxyz");
        lMinor = atoi( lMinorP ) ;
        /*printf("lMinor %d\n", lMinor );*/
        lDate = atoi( strtok(0," ,.-") ) ;
        if (lDate<0) lDate = - lDate;
        /*printf("lDate %d\n", lDate);*/
        lLetter = lMinorP + strlen(lMinorP) ;
        strcpy(lVersion,lBuff);
        strtok(lLetter," ,.-");
        /*printf("lLetter %s\n", lLetter);*/
        lResult = (lMajor > 0) || ( ( lMinor == 9 ) && (*lLetter == 'b') && (lDate >= 20031126) );
        /*printf("lResult %d\n", lResult);*/
        return lResult;
}